

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-lexer.cc
# Opt level: O3

unique_ptr<wabt::WastLexer,_std::default_delete<wabt::WastLexer>_>
wabt::WastLexer::CreateBufferLexer(string_view filename,void *data,size_t size,Errors *errors)

{
  long lVar1;
  LexerSource *this;
  long *plVar2;
  long in_R9;
  
  this = (LexerSource *)operator_new(0x18);
  LexerSource::LexerSource(this,(void *)size,(Offset)errors);
  plVar2 = (long *)operator_new(0x60);
  *plVar2 = (long)this;
  plVar2[1] = (long)(plVar2 + 3);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(plVar2 + 1),data,filename._M_str + (long)data);
  *(undefined4 *)(plVar2 + 5) = 1;
  lVar1 = *(long *)*plVar2;
  plVar2[6] = lVar1;
  plVar2[7] = ((long *)*plVar2)[1] + lVar1;
  plVar2[8] = lVar1;
  plVar2[9] = lVar1;
  plVar2[10] = lVar1;
  plVar2[0xb] = in_R9;
  *(long **)filename._M_len = plVar2;
  return (__uniq_ptr_data<wabt::WastLexer,_std::default_delete<wabt::WastLexer>,_true,_true>)
         (tuple<wabt::WastLexer_*,_std::default_delete<wabt::WastLexer>_>)filename._M_len;
}

Assistant:

std::unique_ptr<WastLexer> WastLexer::CreateBufferLexer(
    std::string_view filename,
    const void* data,
    size_t size,
    Errors* errors) {
  return std::make_unique<WastLexer>(std::make_unique<LexerSource>(data, size),
                                     filename, errors);
}